

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> * __thiscall
pbrt::ParameterDictionary::GetRGBArray
          (vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> *__return_storage_ptr__,
          ParameterDictionary *this,string *name)

{
  double dVar1;
  undefined8 uVar2;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar3;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pRVar5;
  pointer pcVar6;
  undefined1 auVar7 [16];
  vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> *pvVar8;
  __type _Var9;
  bool bVar10;
  ulong uVar11;
  long lVar12;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar13;
  allocator_type local_39;
  vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> *local_38;
  
  paVar3 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar4 = (this->params).nStored;
  paVar13 = &(this->params).field_2;
  if (paVar3 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar13 = paVar3;
  }
  lVar12 = 0;
  local_38 = __return_storage_ptr__;
  while( true ) {
    if (sVar4 << 3 == lVar12) {
      (local_38->super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_38->super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_38->super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      return local_38;
    }
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             ((long)paVar13 + lVar12);
    _Var9 = std::operator==(__lhs + 1,name);
    if ((_Var9) && (bVar10 = std::operator==(__lhs,"rgb"), pvVar8 = local_38, bVar10)) break;
    lVar12 = lVar12 + 8;
  }
  if (__lhs[3].field_2._M_allocated_capacity % 3 == 0) {
    std::vector<pbrt::RGB,_std::allocator<pbrt::RGB>_>::vector
              (local_38,__lhs[3].field_2._M_allocated_capacity / 3,&local_39);
    uVar11 = __lhs[3].field_2._M_allocated_capacity / 3;
    pRVar5 = (pvVar8->super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = 8;
    while (bVar10 = uVar11 != 0, uVar11 = uVar11 - 1, bVar10) {
      pcVar6 = __lhs[3]._M_dataplus._M_p;
      dVar1 = *(double *)(pcVar6 + lVar12 * 2);
      auVar7 = vcvtpd2ps_avx(*(undefined1 (*) [16])(pcVar6 + lVar12 * 2 + -0x10));
      uVar2 = vmovlps_avx(auVar7);
      *(undefined8 *)((long)pRVar5 + lVar12 + -8) = uVar2;
      *(float *)((long)&pRVar5->r + lVar12) = (float)dVar1;
      lVar12 = lVar12 + 0xc;
    }
    __lhs[5].field_2._M_local_buf[8] = '\x01';
    return pvVar8;
  }
  ErrorExit((FileLoc *)(__lhs + 2),
            "Number of values given for \"rgb\" parameter %d \"name\" isn\'t a multiple of 3.");
}

Assistant:

std::vector<RGB> ParameterDictionary::GetRGBArray(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name == name && p->type == "rgb") {
            if (p->numbers.size() % 3)
                ErrorExit(&p->loc, "Number of values given for \"rgb\" parameter %d "
                                   "\"name\" isn't a multiple of 3.");

            std::vector<RGB> rgb(p->numbers.size() / 3);
            for (int i = 0; i < p->numbers.size() / 3; ++i)
                rgb[i] =
                    RGB(p->numbers[3 * i], p->numbers[3 * i + 1], p->numbers[3 * i + 2]);

            p->lookedUp = true;
            return rgb;
        }
    }
    return {};
}